

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

XSAnnotation * __thiscall
xercesc_4_0::TraverseSchema::traverseAnnotationDecl
          (TraverseSchema *this,DOMElement *annotationElem,
          ValueVectorOf<xercesc_4_0::DOMNode_*> *nonXSAttList,bool topLevel)

{
  DOMNode *pDVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  XMLCh *pXVar6;
  long *plVar7;
  undefined4 extraout_var;
  DOMNode *pDVar8;
  DOMNode **ppDVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  XMLFileLoc line;
  XMLFileLoc col;
  DOMNode *attNode;
  XMLSize_t i;
  int annotTokenStart;
  XMLSize_t nonXSAttSize;
  XSAnnotation *theAnnotation;
  DOMNode *textContent_2;
  DOMNode *textContent_1;
  DOMNode *textContent;
  XMLCh *name;
  DOMElement *child;
  XMLCh *contents;
  undefined1 local_40 [8];
  NamespaceScopeManager nsMgr;
  bool topLevel_local;
  ValueVectorOf<xercesc_4_0::DOMNode_*> *nonXSAttList_local;
  DOMElement *annotationElem_local;
  TraverseSchema *this_local;
  
  nsMgr.fSchemaInfo._7_1_ = topLevel;
  NamespaceScopeManager::NamespaceScopeManager
            ((NamespaceScopeManager *)local_40,annotationElem,this->fSchemaInfo,this);
  GeneralAttributeCheck::checkAttributes
            (&this->fAttributeCheck,annotationElem,1,this,(bool)(nsMgr.fSchemaInfo._7_1_ & 1),
             (ValueVectorOf<xercesc_4_0::DOMNode_*> *)0x0);
  child = (DOMElement *)0x0;
  name = (XMLCh *)XUtil::getFirstChildElement(&annotationElem->super_DOMNode);
  if ((DOMElement *)name == (DOMElement *)0x0) {
    iVar3 = (*(annotationElem->super_DOMNode)._vptr_DOMNode[7])();
    plVar7 = (long *)CONCAT44(extraout_var,iVar3);
    if ((plVar7 != (long *)0x0) && (iVar3 = (**(code **)(*plVar7 + 0x20))(), iVar3 == 3)) {
      child = (DOMElement *)(**(code **)(*plVar7 + 0x140))();
    }
  }
  else {
    for (; name != (XMLCh *)0x0; name = (XMLCh *)XUtil::getNextSiblingElement((DOMNode *)name)) {
      pXVar6 = (XMLCh *)(**(code **)(*(long *)name + 0xc0))();
      bVar2 = XMLString::equals(pXVar6,(XMLCh *)SchemaSymbols::fgELT_APPINFO);
      if (bVar2) {
        plVar7 = (long *)(**(code **)(*(long *)name + 0x38))();
        if ((plVar7 != (long *)0x0) && (iVar3 = (**(code **)(*plVar7 + 0x20))(), iVar3 == 3)) {
          child = (DOMElement *)(**(code **)(*plVar7 + 0x140))();
        }
        GeneralAttributeCheck::checkAttributes
                  (&this->fAttributeCheck,(DOMElement *)name,4,this,false,
                   (ValueVectorOf<xercesc_4_0::DOMNode_*> *)0x0);
      }
      else {
        bVar2 = XMLString::equals(pXVar6,(XMLCh *)SchemaSymbols::fgELT_DOCUMENTATION);
        if (bVar2) {
          plVar7 = (long *)(**(code **)(*(long *)name + 0x38))();
          if ((plVar7 != (long *)0x0) && (iVar3 = (**(code **)(*plVar7 + 0x20))(), iVar3 == 3)) {
            child = (DOMElement *)(**(code **)(*plVar7 + 0x140))();
          }
          GeneralAttributeCheck::checkAttributes
                    (&this->fAttributeCheck,(DOMElement *)name,0xe,this,false,
                     (ValueVectorOf<xercesc_4_0::DOMNode_*> *)0x0);
        }
        else {
          reportSchemaError(this,(DOMElement *)name,(XMLCh *)XMLUni::fgXMLErrDomain,0x90);
        }
      }
    }
  }
  if ((child == (DOMElement *)0x0) ||
     (bVar2 = XMLScanner::getIgnoreAnnotations(this->fScanner), bVar2)) {
    this_local = (TraverseSchema *)0x0;
  }
  else {
    pDVar8 = (DOMNode *)ValueVectorOf<xercesc_4_0::DOMNode_*>::size(nonXSAttList);
    if (pDVar8 == (DOMNode *)0x0) {
      nonXSAttSize = (XMLSize_t)XMemory::operator_new(0x58,this->fGrammarPoolMemoryManager);
      XSAnnotation::XSAnnotation
                ((XSAnnotation *)nonXSAttSize,(XMLCh *)child,this->fGrammarPoolMemoryManager);
    }
    else {
      iVar3 = XMLString::patternMatch((XMLCh *)child,(XMLCh *)SchemaSymbols::fgELT_ANNOTATION);
      if (iVar3 == -1) {
        this_local = (TraverseSchema *)0x0;
        goto LAB_00423ebf;
      }
      XMLBuffer::set(&this->fBuffer,(XMLCh *)child,(long)(iVar3 + 10));
      for (attNode = (DOMNode *)0x0; attNode < pDVar8;
          attNode = (DOMNode *)((long)&attNode->_vptr_DOMNode + 1)) {
        ppDVar9 = ValueVectorOf<xercesc_4_0::DOMNode_*>::elementAt(nonXSAttList,(XMLSize_t)attNode);
        pDVar1 = *ppDVar9;
        iVar4 = (*pDVar1->_vptr_DOMNode[0x16])();
        iVar5 = (*pDVar1->_vptr_DOMNode[0x18])();
        iVar4 = (*(annotationElem->super_DOMNode)._vptr_DOMNode[0x30])
                          (annotationElem,CONCAT44(extraout_var_00,iVar4),
                           CONCAT44(extraout_var_01,iVar5));
        bVar2 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_02,iVar4),L"");
        if (bVar2) {
          XMLBuffer::append(&this->fBuffer,L' ');
          iVar4 = (*pDVar1->_vptr_DOMNode[2])();
          XMLBuffer::append(&this->fBuffer,(XMLCh *)CONCAT44(extraout_var_03,iVar4));
          XMLBuffer::append(&this->fBuffer,L'=');
          XMLBuffer::append(&this->fBuffer,L'\"');
          iVar4 = (*pDVar1->_vptr_DOMNode[3])();
          processAttValue(this,(XMLCh *)CONCAT44(extraout_var_04,iVar4),&this->fBuffer);
          XMLBuffer::append(&this->fBuffer,L'\"');
        }
      }
      XMLBuffer::append(&this->fBuffer,
                        (XMLCh *)((long)&child[2].super_DOMNode._vptr_DOMNode + (long)iVar3 * 2 + 4)
                       );
      nonXSAttSize = (XMLSize_t)XMemory::operator_new(0x58,this->fGrammarPoolMemoryManager);
      pXVar6 = XMLBuffer::getRawBuffer(&this->fBuffer);
      XSAnnotation::XSAnnotation
                ((XSAnnotation *)nonXSAttSize,pXVar6,this->fGrammarPoolMemoryManager);
    }
    line = XSDElementNSImpl::getLineNo((XSDElementNSImpl *)annotationElem);
    col = XSDElementNSImpl::getColumnNo((XSDElementNSImpl *)annotationElem);
    XSAnnotation::setLineCol((XSAnnotation *)nonXSAttSize,line,col);
    pXVar6 = SchemaInfo::getCurrentSchemaURL(this->fSchemaInfo);
    XSAnnotation::setSystemId((XSAnnotation *)nonXSAttSize,pXVar6);
    this_local = (TraverseSchema *)nonXSAttSize;
  }
LAB_00423ebf:
  NamespaceScopeManager::~NamespaceScopeManager((NamespaceScopeManager *)local_40);
  return (XSAnnotation *)this_local;
}

Assistant:

XSAnnotation*
TraverseSchema::traverseAnnotationDecl(const DOMElement* const annotationElem,
                                       ValueVectorOf<DOMNode*>* const nonXSAttList,
                                       const bool topLevel) {

    NamespaceScopeManager nsMgr(annotationElem, fSchemaInfo, this);
    // -----------------------------------------------------------------------
    // Check Attributes
    // -----------------------------------------------------------------------
    fAttributeCheck.checkAttributes(
        annotationElem, GeneralAttributeCheck::E_Annotation, this, topLevel
    );

    const XMLCh* contents = 0;
    DOMElement* child = XUtil::getFirstChildElement(annotationElem);
    if (child) {
        for (;
             child != 0;
             child = XUtil::getNextSiblingElement(child)) {

            const XMLCh* name = child->getLocalName();

            if (XMLString::equals(name, SchemaSymbols::fgELT_APPINFO)) {

                DOMNode* textContent = child->getFirstChild();
                if (textContent && textContent->getNodeType() == DOMNode::TEXT_NODE)
                    contents = ((DOMText*) textContent)->getData();

                fAttributeCheck.checkAttributes(child, GeneralAttributeCheck::E_Appinfo, this);
            }
            else if (XMLString::equals(name, SchemaSymbols::fgELT_DOCUMENTATION)) {

                DOMNode* textContent = child->getFirstChild();
                if (textContent && textContent->getNodeType() == DOMNode::TEXT_NODE)
                    contents = ((DOMText*) textContent)->getData();

                fAttributeCheck.checkAttributes(child, GeneralAttributeCheck::E_Documentation, this);
            }
            else {
                reportSchemaError(child, XMLUni::fgXMLErrDomain, XMLErrs::InvalidAnnotationContent);
            }
        }
    }
    else
    {
        // If the Annotation has no children, get the text directly
        DOMNode* textContent = annotationElem->getFirstChild();
        if (textContent && textContent->getNodeType() == DOMNode::TEXT_NODE)
            contents = ((DOMText*) textContent)->getData();
    }

    if (contents && !fScanner->getIgnoreAnnotations())
    {
        XSAnnotation* theAnnotation = 0;

        XMLSize_t nonXSAttSize = nonXSAttList->size();

        if (nonXSAttSize)
        {
            int annotTokenStart = XMLString::patternMatch(
                contents, SchemaSymbols::fgELT_ANNOTATION);

            if (annotTokenStart == -1) // something is wrong
                return 0;

            // set annotation element
            fBuffer.set(contents, annotTokenStart + 10);

            for (XMLSize_t i=0; i<nonXSAttSize; i++)
            {
                DOMNode* attNode = nonXSAttList->elementAt(i);

                if (!XMLString::equals(
                        annotationElem->getAttributeNS(
                           attNode->getNamespaceURI(), attNode->getLocalName())
                        , XMLUni::fgZeroLenString)
                   )
                {
                    continue;
                }

                fBuffer.append(chSpace);
                fBuffer.append(attNode->getNodeName());
                fBuffer.append(chEqual);
                fBuffer.append(chDoubleQuote);
                processAttValue(attNode->getNodeValue(), fBuffer);
                fBuffer.append(chDoubleQuote);
            }

            // add remaining annotation content
            fBuffer.append(contents + annotTokenStart + 10);

            theAnnotation = new (fGrammarPoolMemoryManager) XSAnnotation(fBuffer.getRawBuffer(), fGrammarPoolMemoryManager);
        }
        else
        {
            theAnnotation = new (fGrammarPoolMemoryManager) XSAnnotation(contents, fGrammarPoolMemoryManager);
        }

        /***
         * set line, col and systemId info
        ***/
        theAnnotation->setLineCol(
                                  ((XSDElementNSImpl*)annotationElem)->getLineNo()
                                , ((XSDElementNSImpl*)annotationElem)->getColumnNo()
                                 );
        theAnnotation->setSystemId(fSchemaInfo->getCurrentSchemaURL());

        return theAnnotation;
    }

    return 0;
}